

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

void set_insert_node_hash(lyxp_set *set,lyd_node *node,lyxp_node_type type)

{
  LY_ERR LVar1;
  ly_ht *plVar2;
  lyd_node *local_34;
  lyxp_set_hash_node hnode;
  uint32_t hash;
  uint32_t i;
  LY_ERR r;
  lyxp_node_type type_local;
  lyd_node *node_local;
  lyxp_set *set_local;
  
  if ((set->ht == (ly_ht *)0x0) && (3 < set->used)) {
    plVar2 = lyht_new(1,0xc,set_values_equal_cb,(void *)0x0,1);
    set->ht = plVar2;
    for (hnode.type = LYXP_NODE_NONE; hnode.type < set->used;
        hnode.type = hnode.type + LYXP_NODE_ROOT) {
      local_34 = (set->val).nodes[hnode.type].node;
      hnode.node._0_4_ = (set->val).nodes[hnode.type].type;
      hnode.node._4_4_ = lyht_hash_multi(0,(char *)&local_34,8);
      hnode.node._4_4_ = lyht_hash_multi(hnode.node._4_4_,(char *)&hnode,4);
      hnode.node._4_4_ = lyht_hash_multi(hnode.node._4_4_,(char *)0x0,0);
      LVar1 = lyht_insert(set->ht,&local_34,hnode.node._4_4_,(void **)0x0);
      if (LVar1 != LY_SUCCESS) {
        __assert_fail("!r",
                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                      ,0x2f0,
                      "void set_insert_node_hash(struct lyxp_set *, struct lyd_node *, enum lyxp_node_type)"
                     );
      }
      if ((local_34 == node) && ((lyxp_node_type)hnode.node == type)) {
        return;
      }
    }
  }
  if (set->ht != (ly_ht *)0x0) {
    local_34 = node;
    hnode.node._0_4_ = type;
    hnode.node._4_4_ = lyht_hash_multi(0,(char *)&local_34,8);
    hnode.node._4_4_ = lyht_hash_multi(hnode.node._4_4_,(char *)&hnode,4);
    hnode.node._4_4_ = lyht_hash_multi(hnode.node._4_4_,(char *)0x0,0);
    LVar1 = lyht_insert(set->ht,&local_34,hnode.node._4_4_,(void **)0x0);
    if (LVar1 != LY_SUCCESS) {
      __assert_fail("!r",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                    ,0x304,
                    "void set_insert_node_hash(struct lyxp_set *, struct lyd_node *, enum lyxp_node_type)"
                   );
    }
  }
  return;
}

Assistant:

static void
set_insert_node_hash(struct lyxp_set *set, struct lyd_node *node, enum lyxp_node_type type)
{
    LY_ERR r;
    uint32_t i, hash;
    struct lyxp_set_hash_node hnode;

    if (!set->ht && (set->used >= LYD_HT_MIN_ITEMS)) {
        /* create hash table and add all the nodes */
        set->ht = lyht_new(1, sizeof(struct lyxp_set_hash_node), set_values_equal_cb, NULL, 1);
        for (i = 0; i < set->used; ++i) {
            hnode.node = set->val.nodes[i].node;
            hnode.type = set->val.nodes[i].type;

            hash = lyht_hash_multi(0, (const char *)&hnode.node, sizeof hnode.node);
            hash = lyht_hash_multi(hash, (const char *)&hnode.type, sizeof hnode.type);
            hash = lyht_hash_multi(hash, NULL, 0);

            r = lyht_insert(set->ht, &hnode, hash, NULL);
            assert(!r);
            (void)r;

            if ((hnode.node == node) && (hnode.type == type)) {
                /* it was just added, do not add it twice */
                return;
            }
        }
    }

    if (set->ht) {
        /* add the new node into hash table */
        hnode.node = node;
        hnode.type = type;

        hash = lyht_hash_multi(0, (const char *)&hnode.node, sizeof hnode.node);
        hash = lyht_hash_multi(hash, (const char *)&hnode.type, sizeof hnode.type);
        hash = lyht_hash_multi(hash, NULL, 0);

        r = lyht_insert(set->ht, &hnode, hash, NULL);
        assert(!r);
        (void)r;
    }
}